

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall argo::lexer::read_number(lexer *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int extraout_EAX;
  size_t sVar4;
  undefined8 extraout_RAX;
  token_type t;
  long lVar5;
  size_t n;
  token local_50;
  
  iVar1 = (*this->m_reader->_vptr_reader[2])();
  n = 0;
  if (iVar1 - 0x30U < 10) {
    lVar5 = 1;
LAB_0011314f:
    append_to_number_buffer(this,this->m_buffer,&n,iVar1);
    lVar5 = -lVar5;
    while( true ) {
      uVar2 = (*this->m_reader->_vptr_reader[2])();
      if (9 < uVar2 - 0x30) break;
      append_to_number_buffer(this,this->m_buffer,&n,uVar2);
      lVar5 = lVar5 + -1;
    }
    (*this->m_reader->_vptr_reader[3])(this->m_reader,(ulong)uVar2);
    if (lVar5 == -1) {
LAB_001131c4:
      uVar3 = (*this->m_reader->_vptr_reader[2])();
      uVar2 = uVar3;
      if (uVar3 == 0x2e) {
        append_to_number_buffer(this,this->m_buffer,&n,0x2e);
        sVar4 = read_digits(this,&n);
        if (sVar4 == 0) {
          iVar1 = 0x2e;
          goto LAB_001132d9;
        }
        uVar2 = (*this->m_reader->_vptr_reader[2])();
      }
      if ((uVar2 & 0xffffffdf) != 0x45) {
        (*this->m_reader->_vptr_reader[3])(this->m_reader,(ulong)uVar2);
        t = uVar3 == 0x2e | number_int_e;
LAB_00113283:
        token::token(&local_50,t,this->m_buffer,n);
        token::operator=(&this->m_token,&local_50);
        token::~token(&local_50);
        return;
      }
      append_to_number_buffer(this,this->m_buffer,&n,uVar2);
      uVar2 = (*this->m_reader->_vptr_reader[2])();
      if ((uVar2 == 0x2d) || (uVar2 == 0x2b)) {
        append_to_number_buffer(this,this->m_buffer,&n,uVar2);
        sVar4 = read_digits(this,&n);
        if (sVar4 != 0) {
          t = number_double_e;
          goto LAB_00113283;
        }
      }
LAB_001132bf:
      throw_number_exception(this,uVar2);
      iVar1 = extraout_EAX;
      goto LAB_001132c9;
    }
    if (lVar5 == 0) goto LAB_001132bf;
    if (this->m_buffer[lVar5 + n] != '0') goto LAB_001131c4;
  }
  else {
    if (iVar1 == 0x2d) {
      iVar1 = 0x2d;
      lVar5 = 0;
      goto LAB_0011314f;
    }
LAB_001132c9:
    throw_number_exception(this,iVar1);
  }
  iVar1 = 0x30;
LAB_001132d9:
  throw_number_exception(this,iVar1);
  token::~token(&local_50);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void lexer::read_number()
{
    int c = m_reader.next();

    size_t n = 0;
    bool is_double = false;
    size_t num_int_digits = 0;

    // - or digit
    if (isdigit(c))
    {
        append_to_number_buffer(m_buffer, n, c);
        num_int_digits++;
    }
    else if (c == '-')
    {
        append_to_number_buffer(m_buffer, n, c);
    }
    else
    {
        throw_number_exception(c);
    }

    // some digits
    while (true)
    {
        c = m_reader.next();

        if (isdigit(c))
        {
            append_to_number_buffer(m_buffer, n, c);
            num_int_digits++;
        }
        else
        {
            m_reader.put_back(c);
            break;
        }
    }

    if (num_int_digits == 0)
    {
        // Must be at least one digit in the buffer
        throw_number_exception(c);
    }
    else if (num_int_digits > 1 && m_buffer[n - num_int_digits] == '0')
    {
        // If there's more than one digit, the first one must not be zero. No leading zeroes
        // are allowed by the standard.
        throw_number_exception('0');
    }

    c = m_reader.next();

    // maybe followed by a point
    if (c == '.')
    {
        append_to_number_buffer(m_buffer, n, c);
        is_double = true;

        // followed by more digits
        if (read_digits(n) == 0)
        {
            throw_number_exception(c);
        }

        c = m_reader.next();
    }

    // e/E
    if (c == 'e' || c == 'E')
    {
        append_to_number_buffer(m_buffer, n, c);
        is_double = true;

        // +/-
        c = m_reader.next();

        if (c == '+' || c == '-')
        {
            append_to_number_buffer(m_buffer, n, c);

            // some digits
            if (read_digits(n) == 0)
            {
                throw_number_exception(c);
            }
        }
        else 
        {
            throw_number_exception(c);
        }
    }
    else
    {
        m_reader.put_back(c);
    }

    m_token = token(is_double ? token::number_double_e : token::number_int_e, m_buffer, n);
}